

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::XThreadEvent::traceEvent(XThreadEvent *this)

{
  Executor *pEVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long in_RSI;
  
  pEVar1 = (this->targetExecutor).ptr;
  if (pEVar1 != (Executor *)0x0) {
    (*pEVar1->_vptr_Executor[4])();
  }
  puVar2 = *(undefined8 **)(in_RSI + 8);
  if (puVar2 < *(undefined8 **)(in_RSI + 0x10)) {
    uVar3 = *(undefined8 *)&(this->super_Event).location.lineNumber;
    *(undefined8 **)(in_RSI + 8) = puVar2 + 1;
    *puVar2 = uVar3;
  }
  return;
}

Assistant:

void XThreadEvent::traceEvent(TraceBuilder& builder) {
  KJ_IF_SOME(n, promiseNode) {
    n->tracePromise(builder, true);
  }

  // We can't safely trace into another thread, so we'll stop here.
  builder.add(funcTracePtr);
}